

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPile.cpp
# Opt level: O3

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall solitaire::piles::FoundationPile::createSnapshot(FoundationPile *this)

{
  _func_int *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  long in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  
  std::__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<solitaire::piles::FoundationPile,void>
            ((__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 8));
  pp_Var3 = (_func_int **)operator_new(0x30);
  p_Var2 = p_Stack_50;
  p_Var1 = local_58;
  local_58 = (_func_int *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_48,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (in_RSI + 0x18));
  *pp_Var3 = (_func_int *)&PTR__Snapshot_001158f8;
  pp_Var3[1] = p_Var1;
  pp_Var3[2] = (_func_int *)p_Var2;
  pp_Var3[3] = (_func_int *)
               local_48.
               super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
               _M_impl.super__Vector_impl_data._M_start;
  pp_Var3[4] = (_func_int *)
               local_48.
               super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  pp_Var3[5] = (_func_int *)
               local_48.
               super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_FoundationPile).super_Archiver._vptr_Archiver = pp_Var3;
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<archivers::interfaces::Snapshot> FoundationPile::createSnapshot() {
    return std::make_unique<Snapshot>(shared_from_this(), cards);
}